

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void fullinc(lua_State *L,global_State *g)

{
  global_State *pgVar1;
  GCObject **p;
  GCObject **old;
  
  if (g->gcstate < 3) {
    pgVar1 = L->l_G;
    pgVar1->gcstate = '\x03';
    p = &pgVar1->allgc;
    do {
      p = sweeplist(L,p,1);
    } while (p == &pgVar1->allgc);
    pgVar1->sweepgc = p;
  }
  pgVar1 = L->l_G;
  while (pgVar1->gcstate != '\b') {
    singlestep(L,1);
  }
  pgVar1 = L->l_G;
  while (pgVar1->gcstate != '\a') {
    singlestep(L,1);
  }
  pgVar1 = L->l_G;
  while (pgVar1->gcstate != '\b') {
    singlestep(L,1);
  }
  setpause(g);
  return;
}

Assistant:

static void fullinc (lua_State *L, global_State *g) {
  if (keepinvariant(g))  /* black objects? */
    entersweep(L); /* sweep everything to turn them back to white */
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, GCSpause, 1);
  luaC_runtilstate(L, GCScallfin, 1);  /* run up to finalizers */
  luaC_runtilstate(L, GCSpause, 1);  /* finish collection */
  setpause(g);
}